

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O1

void __thiscall
CodeGenGenericContext::InvalidateAddressValue(CodeGenGenericContext *this,x86Argument arg)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  x86Reg xVar4;
  undefined4 uVar5;
  long lVar6;
  
  if (arg.type != argPtr) {
    __assert_fail("arg.type == x86Argument::argPtr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x112,"void CodeGenGenericContext::InvalidateAddressValue(x86Argument)");
  }
  xVar4 = arg.ptrBase ^ rEBX;
  uVar5 = (uint)(arg.field_1.reg != rECX) * 4 + rEDX;
  if (arg.field_1.reg < rECX) {
    uVar5 = arg.field_1.reg;
  }
  lVar6 = 0;
  do {
    if (*(int *)((long)&this->genReg[0].type + lVar6) == 4) {
      iVar1 = *(int *)((long)&this->genReg[0].ptrIndex + lVar6);
      if (iVar1 == 0) {
        if (((*(int *)((long)&this->genReg[0].ptrBase + lVar6) != 0xf) &&
            (*(int *)((long)&this->genReg[0].ptrBase + lVar6) != 2 ||
             arg.ptrIndex == rNONE && xVar4 == rNONE)) &&
           ((arg.ptrIndex != rNONE || xVar4 != rNONE) ||
            *(int *)((long)&this->genReg[0].ptrBase + lVar6) == 2)) goto LAB_001e2a67;
      }
      else if (arg.ptrIndex != rNONE || xVar4 != rNONE) {
LAB_001e2a67:
        if ((iVar1 == 0 && arg.ptrIndex == rNONE) &&
           (*(x86Reg *)((long)&this->genReg[0].ptrBase + lVar6) == arg.ptrBase)) {
          uVar2 = *(uint *)((long)&this->genReg[0].field_1 + lVar6);
          if (uVar2 == 0) {
            __assert_fail("data.ptrSize != sNONE",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                          ,0x128,"void CodeGenGenericContext::InvalidateAddressValue(x86Argument)");
          }
          if (arg.field_1.reg == rNONE) {
            __assert_fail("arg.ptrSize != sNONE",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                          ,0x129,"void CodeGenGenericContext::InvalidateAddressValue(x86Argument)");
          }
          uVar3 = (uint)(uVar2 != 3) * 4 + 4;
          if (uVar2 < 3) {
            uVar3 = uVar2;
          }
          uVar2 = *(uint *)((long)&this->genReg[0].ptrNum + lVar6);
          if (((uint)(uVar5 + arg.ptrNum) <= uVar2) || (uVar2 + uVar3 <= (uint)arg.ptrNum))
          goto LAB_001e2ac1;
        }
        *(undefined4 *)((long)&this->genReg[0].type + lVar6) = 0;
      }
    }
LAB_001e2ac1:
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0x220);
  xVar4 = arg.ptrBase ^ rEBX;
  lVar6 = 0;
  do {
    if (*(int *)((long)&this->xmmReg[0].type + lVar6) == 4) {
      iVar1 = *(int *)((long)&this->xmmReg[0].ptrIndex + lVar6);
      if (iVar1 == 0) {
        if (((*(int *)((long)&this->xmmReg[0].ptrBase + lVar6) != 0xf) &&
            (*(int *)((long)&this->xmmReg[0].ptrBase + lVar6) != 2 ||
             arg.ptrIndex == rNONE && xVar4 == rNONE)) &&
           ((arg.ptrIndex != rNONE || xVar4 != rNONE) ||
            *(int *)((long)&this->xmmReg[0].ptrBase + lVar6) == 2)) goto LAB_001e2b59;
      }
      else if (arg.ptrIndex != rNONE || xVar4 != rNONE) {
LAB_001e2b59:
        if ((iVar1 == 0 && arg.ptrIndex == rNONE) &&
           (*(x86Reg *)((long)&this->xmmReg[0].ptrBase + lVar6) == arg.ptrBase)) {
          iVar1 = *(int *)((long)&this->xmmReg[0].field_1 + lVar6);
          if (1 < iVar1 - 3U) {
            __assert_fail("data.ptrSize == sDWORD || data.ptrSize == sQWORD",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                          ,0x14a,"void CodeGenGenericContext::InvalidateAddressValue(x86Argument)");
          }
          uVar2 = *(uint *)((long)&this->xmmReg[0].ptrNum + lVar6);
          if ((arg.ptrNum + 4 + (uint)(arg.field_1.reg != rECX) * 4 <= uVar2) ||
             (uVar2 + (uint)(iVar1 != 3) * 4 + 4 <= (uint)arg.ptrNum)) goto LAB_001e2bb6;
        }
        *(undefined4 *)((long)&this->xmmReg[0].type + lVar6) = 0;
      }
    }
LAB_001e2bb6:
    lVar6 = lVar6 + 0x20;
    if (lVar6 == 0x200) {
      return;
    }
  } while( true );
}

Assistant:

void CodeGenGenericContext::InvalidateAddressValue(x86Argument arg)
{
	assert(arg.type == x86Argument::argPtr);

	for(unsigned i = 0; i < rRegCount; i++)
	{
		x86Argument &data = genReg[i];

		if(data.type == x86Argument::argPtr)
		{
			// Can't rewrite constants
			if(data.ptrIndex == rNONE && data.ptrBase == rR14)
				continue;

			// If register contains data from register memory block, no memory update using a different register can overwrite it
			if(data.ptrIndex == rNONE && data.ptrBase == rEBX && (arg.ptrIndex != rNONE || arg.ptrBase != rEBX))
				continue;

			// If register doesn't contain data from a register memory block, register memory update can't overwrite it
			if((data.ptrIndex != rNONE || data.ptrBase != rEBX) && arg.ptrIndex == rNONE && arg.ptrBase == rEBX)
				continue;

			if(data.ptrIndex == rNONE && arg.ptrIndex == rNONE && data.ptrBase == arg.ptrBase)
			{
				assert(data.ptrSize != sNONE);
				assert(arg.ptrSize != sNONE);

				unsigned dataSize = data.ptrSize == sBYTE ? 1 : (data.ptrSize == sWORD ? 2 : (data.ptrSize == sDWORD ? 4 : 8));
				unsigned argSize = arg.ptrSize == sBYTE ? 1 : (arg.ptrSize == sWORD ? 2 : (arg.ptrSize == sDWORD ? 4 : 8));

				if(unsigned(arg.ptrNum) + argSize <= unsigned(data.ptrNum) || unsigned(arg.ptrNum) >= unsigned(data.ptrNum) + dataSize)
					continue;
			}

			data.type = x86Argument::argNone;
		}
	}

	for(unsigned i = 0; i < rXmmRegCount; i++)
	{
		x86Argument &data = xmmReg[i];

		if(data.type == x86Argument::argPtr)
		{
			// Can't rewrite constants
			if(data.ptrIndex == rNONE && data.ptrBase == rR14)
				continue;

			// If register contains data from register memory block, no memory update using a different register can overwrite it
			if(data.ptrIndex == rNONE && data.ptrBase == rEBX && (arg.ptrIndex != rNONE || arg.ptrBase != rEBX))
				continue;

			// If register doesn't contain data from a register memory block, register memory update can't overwrite it
			if((data.ptrIndex != rNONE || data.ptrBase != rEBX) && arg.ptrIndex == rNONE && arg.ptrBase == rEBX)
				continue;

			if(data.ptrIndex == rNONE && arg.ptrIndex == rNONE && data.ptrBase == arg.ptrBase)
			{
				assert(data.ptrSize == sDWORD || data.ptrSize == sQWORD);
				assert(data.ptrSize == sDWORD || data.ptrSize == sQWORD);

				unsigned dataSize = data.ptrSize == sDWORD ? 4 : 8;
				unsigned argSize = arg.ptrSize == sDWORD ? 4 : 8;

				if(unsigned(arg.ptrNum) + argSize <= unsigned(data.ptrNum) || unsigned(arg.ptrNum) >= unsigned(data.ptrNum) + dataSize)
					continue;
			}

			data.type = x86Argument::argNone;
		}
	}
}